

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22460c::BNTest_ASN1_Test::TestBody(BNTest_ASN1_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  BIGNUM *pBVar4;
  pointer pbVar5;
  cbb_st *pcVar6;
  Message *pMVar7;
  pointer in_R9;
  string local_4c8;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_460;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__9;
  ScopedCBB cbb;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<BIGNUM> bn;
  AssertHelper local_3a0;
  Message local_398;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__7;
  CBS cbs_1;
  AssertHelper local_348;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<BIGNUM> bn_2;
  ScopedTrace local_309;
  ASN1InvalidTest *pAStack_308;
  ScopedTrace gtest_trace_1448;
  ASN1InvalidTest *test_1;
  ASN1InvalidTest *__end1_1;
  ASN1InvalidTest *__begin1_1;
  ASN1InvalidTest (*__range1_1) [5];
  Message local_2e0;
  Bytes local_2d8;
  Bytes local_2c8;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_2;
  UniquePtr<uint8_t> delete_der;
  AssertHelper local_280;
  Message local_278;
  int local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_238;
  Message local_230;
  int local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1f0;
  Message local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__3;
  size_t der_len;
  uint8_t *der;
  ScopedCBB cbb_1;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_1;
  Message local_160;
  size_t local_158;
  uint local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__2;
  CBS cbs;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIGNUM> bn2;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_40;
  UniquePtr<BIGNUM> bn_1;
  ScopedTrace gtest_trace_1423;
  ASN1Test *test;
  ASN1Test *__end1;
  ASN1Test *__begin1;
  ASN1Test (*__range1) [7];
  BNTest_ASN1_Test *this_local;
  
  __end1 = (ASN1Test *)&(anonymous_namespace)::kASN1Tests;
  while( true ) {
    if (__end1 == (ASN1Test *)&DAT_00aa1158) {
      __end1_1 = (ASN1InvalidTest *)&(anonymous_namespace)::kASN1InvalidTests;
      while( true ) {
        if (__end1_1 ==
            (ASN1InvalidTest *)
            &testing::internal::TestFactoryImpl<(anonymous_namespace)::BNTest_NegativeZero_Test>::
             vtable) {
          ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&gtest_ar__8.message_,"-1");
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_3d8,
                     (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
          if (!bVar1) {
            testing::Message::Message(&local_3e0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)((long)&cbb.ctx_.u + 0x18),(internal *)local_3d8,
                       (AssertionResult *)0x84bde6,"false","true",(char *)in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x5b4,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
            testing::internal::AssertHelper::~AssertHelper(&local_3e8);
            std::__cxx11::string::~string((string *)((long)&cbb.ctx_.u + 0x18));
            testing::Message::~Message(&local_3e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
          if (bVar1) {
            bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                       &gtest_ar__9.message_);
            pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                &gtest_ar__9.message_);
            local_44c = CBB_init(pcVar6,0);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_448,&local_44c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
            if (!bVar1) {
              testing::Message::Message(&local_458);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__10.message_,(internal *)local_448,
                         (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",(char *)in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_460,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5b6,pcVar3);
              testing::internal::AssertHelper::operator=(&local_460,&local_458);
              testing::internal::AssertHelper::~AssertHelper(&local_460);
              std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
              testing::Message::~Message(&local_458);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
            if (bVar1) {
              pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &gtest_ar__9.message_);
              pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__8.message_);
              iVar2 = BN_marshal_asn1(pcVar6,pbVar5);
              local_491 = iVar2 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_490,&local_491,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
              if (!bVar1) {
                testing::Message::Message(&local_4a0);
                pMVar7 = testing::Message::operator<<
                                   (&local_4a0,(char (*) [28])"Serialized negative number.");
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_4c8,(internal *)local_490,
                           (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","true","false",
                           (char *)in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5b7,pcVar3);
                testing::internal::AssertHelper::operator=(&local_4a8,pMVar7);
                testing::internal::AssertHelper::~AssertHelper(&local_4a8);
                std::__cxx11::string::~string((string *)&local_4c8);
                testing::Message::~Message(&local_4a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
              ERR_clear_error();
            }
            bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                       &gtest_ar__9.message_);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
          return;
        }
        pAStack_308 = __end1_1;
        Bytes::Bytes((Bytes *)&bn_2,__end1_1->der,__end1_1->der_len);
        testing::ScopedTrace::ScopedTrace<Bytes>
                  (&local_309,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a8,(Bytes *)&bn_2);
        pBVar4 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                   (pointer)pBVar4);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_338,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
        if (!bVar1) {
          testing::Message::Message(&local_340);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&cbs_1.len,(internal *)local_338,(AssertionResult *)0x84bde6,"false",
                     "true",(char *)in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_348,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x5aa,pcVar3);
          testing::internal::AssertHelper::operator=(&local_348,&local_340);
          testing::internal::AssertHelper::~AssertHelper(&local_348);
          std::__cxx11::string::~string((string *)&cbs_1.len);
          testing::Message::~Message(&local_340);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
        if (!bVar1) {
          CBS_init((CBS *)&gtest_ar__7.message_,(uint8_t *)pAStack_308->der,pAStack_308->der_len);
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &gtest_ar__6.message_);
          iVar2 = BN_parse_asn1_unsigned((CBS *)&gtest_ar__7.message_,pbVar5);
          local_389 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_388,&local_389,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
          if (!bVar1) {
            testing::Message::Message(&local_398);
            pMVar7 = testing::Message::operator<<(&local_398,(char (*) [22])"Parsed invalid input.")
            ;
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&bn,(internal *)local_388,
                       (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn.get())","true","false",
                       (char *)in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x5ad,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3a0,pMVar7);
            testing::internal::AssertHelper::~AssertHelper(&local_3a0);
            std::__cxx11::string::~string((string *)&bn);
            testing::Message::~Message(&local_398);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
          ERR_clear_error();
          bVar1 = false;
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
        testing::ScopedTrace::~ScopedTrace(&local_309);
        if (bVar1) break;
        __end1_1 = __end1_1 + 1;
      }
      return;
    }
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)
               ((long)&bn_1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x58f,__end1->value_ascii);
    ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&local_40,__end1->value_ascii);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_60,&local_40,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_60,(AssertionResult *)0x84bde6,"false","true",
                 (char *)in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x591,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      testing::Message::~Message(&local_68);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (!bVar1) {
      pBVar4 = BN_new();
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
                 (pointer)pBVar4);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_b0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
      if (!bVar1) {
        testing::Message::Message(&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&cbs.len,(internal *)local_b0,(AssertionResult *)"bn2","false","true",
                   (char *)in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x595,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        std::__cxx11::string::~string((string *)&cbs.len);
        testing::Message::~Message(&local_b8);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
      if (!bVar1) {
        CBS_init((CBS *)&gtest_ar__2.message_,(uint8_t *)__end1->der,__end1->der_len);
        pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_)
        ;
        local_104 = BN_parse_asn1_unsigned((CBS *)&gtest_ar__2.message_,pbVar5);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_100,&local_104,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
        if (!bVar1) {
          testing::Message::Message(&local_110);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_100,
                     (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn2.get())","false","true",
                     (char *)in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x598,pcVar3);
          testing::internal::AssertHelper::operator=(&local_118,&local_110);
          testing::internal::AssertHelper::~AssertHelper(&local_118);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_110);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
        if (!bVar1) {
          local_14c = 0;
          local_158 = CBS_len((CBS *)&gtest_ar__2.message_);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_148,"0u","CBS_len(&cbs)",&local_14c,&local_158);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
          if (!bVar1) {
            testing::Message::Message(&local_160);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x599,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_160);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_160);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
          in_R9 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_40);
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_178,"\"decode ASN.1\"","bn.get()",
                             "bn2.get()","decode ASN.1",in_R9,pbVar5);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
          if (!bVar1) {
            testing::Message::Message(&local_180);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)((long)&cbb_1.ctx_.u + 0x18),kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x59a,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)((long)&cbb_1.ctx_.u + 0x18),&local_180);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)((long)&cbb_1.ctx_.u + 0x18));
            testing::Message::~Message(&local_180);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
          bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
          pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
          local_1dc = CBB_init(pcVar6,0);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1d8,&local_1dc,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar1) {
            testing::Message::Message(&local_1e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_1d8,
                       (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",(char *)in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x5a0,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper(&local_1f0);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_1e8);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
          if (!bVar1) {
            pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
            pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_40);
            local_224 = BN_marshal_asn1(pcVar6,pbVar5);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_220,&local_224,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
            if (!bVar1) {
              testing::Message::Message(&local_230);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_220,
                         (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","false","true",
                         (char *)in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_238,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5a1,pcVar3);
              testing::internal::AssertHelper::operator=(&local_238,&local_230);
              testing::internal::AssertHelper::~AssertHelper(&local_238);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_230);
            }
            bVar1 = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
            if (!bVar1) {
              pcVar6 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
              local_26c = CBB_finish(pcVar6,(uint8_t **)&der_len,(size_t *)&gtest_ar__3.message_);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_268,&local_26c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
              if (!bVar1) {
                testing::Message::Message(&local_278);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&delete_der,(internal *)local_268,
                           (AssertionResult *)"CBB_finish(cbb.get(), &der, &der_len)","false","true"
                           ,(char *)in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_280,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5a2,pcVar3);
                testing::internal::AssertHelper::operator=(&local_280,&local_278);
                testing::internal::AssertHelper::~AssertHelper(&local_280);
                std::__cxx11::string::~string((string *)&delete_der);
                testing::Message::~Message(&local_278);
              }
              bVar1 = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
              if (!bVar1) {
                std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar_2.message_
                           ,(pointer)der_len);
                Bytes::Bytes(&local_2c8,__end1->der,__end1->der_len);
                Bytes::Bytes(&local_2d8,(uint8_t *)der_len,
                             (size_t)gtest_ar__3.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                          ((EqHelper *)local_2b8,"Bytes(test.der, test.der_len)",
                           "Bytes(der, der_len)",&local_2c8,&local_2d8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2b8);
                if (!bVar1) {
                  testing::Message::Message(&local_2e0);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&__range1_1,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5a4,pcVar3);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_1,&local_2e0)
                  ;
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_1);
                  testing::Message::~Message(&local_2e0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                           &gtest_ar_2.message_);
                bVar1 = false;
              }
            }
          }
          bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
        }
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&bn_1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7));
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST_F(BNTest, ASN1) {
  for (const ASN1Test &test : kASN1Tests) {
    SCOPED_TRACE(test.value_ascii);
    bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM(test.value_ascii);
    ASSERT_TRUE(bn);

    // Test that the input is correctly parsed.
    bssl::UniquePtr<BIGNUM> bn2(BN_new());
    ASSERT_TRUE(bn2);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    ASSERT_TRUE(BN_parse_asn1_unsigned(&cbs, bn2.get()));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_BIGNUMS_EQUAL("decode ASN.1", bn.get(), bn2.get());

    // Test the value serializes correctly.
    bssl::ScopedCBB cbb;
    uint8_t *der;
    size_t der_len;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(BN_marshal_asn1(cbb.get(), bn.get()));
    ASSERT_TRUE(CBB_finish(cbb.get(), &der, &der_len));
    bssl::UniquePtr<uint8_t> delete_der(der);
    EXPECT_EQ(Bytes(test.der, test.der_len), Bytes(der, der_len));
  }

  for (const ASN1InvalidTest &test : kASN1InvalidTests) {
    SCOPED_TRACE(Bytes(test.der, test.der_len));
    bssl::UniquePtr<BIGNUM> bn(BN_new());
    ASSERT_TRUE(bn);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    EXPECT_FALSE(BN_parse_asn1_unsigned(&cbs, bn.get()))
        << "Parsed invalid input.";
    ERR_clear_error();
  }

  // Serializing negative numbers is not supported.
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("-1");
  ASSERT_TRUE(bn);
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  EXPECT_FALSE(BN_marshal_asn1(cbb.get(), bn.get()))
      << "Serialized negative number.";
  ERR_clear_error();
}